

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Sector_SetCeilingScale
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  uint uVar1;
  undefined4 unaff_EBP;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  FSectorTagIterator itr;
  
  auVar4._0_8_ = (double)arg4;
  auVar4._8_8_ = (double)arg2;
  auVar4 = divpd(auVar4,_DAT_005cfc30);
  auVar5._0_8_ = auVar4._0_8_ + (double)arg3;
  auVar5._8_8_ = auVar4._8_8_ + (double)arg1;
  auVar4 = divpd(_DAT_005a6510,auVar5);
  dVar6 = (double)(~-(ulong)(auVar5._0_8_ != 0.0) & (ulong)auVar5._0_8_ |
                  auVar4._0_8_ & -(ulong)(auVar5._0_8_ != 0.0));
  dVar7 = (double)(~-(ulong)(auVar5._8_8_ != 0.0) & (ulong)auVar5._8_8_ |
                  auVar4._8_8_ & -(ulong)(auVar5._8_8_ != 0.0));
  if (arg0 == 0) {
    itr.start = 0;
  }
  else {
    itr.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  auVar3._8_8_ = -(ulong)(dVar7 != 0.0);
  auVar3._0_8_ = -(ulong)(dVar6 != 0.0);
  uVar2 = movmskpd(unaff_EBP,auVar3);
  itr.searchtag = arg0;
  while( true ) {
    uVar1 = FSectorTagIterator::Next(&itr);
    if ((int)uVar1 < 0) break;
    if ((byte)((byte)uVar2 >> 1) != 0) {
      sectors[uVar1].planes[1].xform.xScale = dVar7;
    }
    if ((uVar2 & 1) != 0) {
      sectors[uVar1].planes[1].xform.yScale = dVar6;
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetCeilingScale)
// Sector_SetCeilingScale (tag, x-int, x-frac, y-int, y-frac)
{
	double xscale = arg1 + arg2 / 100.;
	double yscale = arg3 + arg4 / 100.;

	if (xscale)
		xscale = 1. / xscale;
	if (yscale)
		yscale = 1. / yscale;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		if (xscale)
			sectors[secnum].SetXScale(sector_t::ceiling, xscale);
		if (yscale)
			sectors[secnum].SetYScale(sector_t::ceiling, yscale);
	}
	return true;
}